

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O0

XMLElement * CMU462::Collada::ColladaParser::get_technique_common(XMLElement *xml)

{
  bool bVar1;
  XMLElement *this;
  char *__s;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string sid;
  XMLElement *technique;
  XMLElement *common_profile;
  XMLElement *xml_local;
  
  this = tinyxml2::XMLNode::FirstChildElement(&xml->super_XMLNode,"profile_COMMON");
  if (this == (XMLElement *)0x0) {
LAB_001df9cb:
    xml_local = tinyxml2::XMLNode::FirstChildElement(&xml->super_XMLNode,"technique_common");
  }
  else {
    sid.field_2._8_8_ = tinyxml2::XMLNode::FirstChildElement(&this->super_XMLNode,"technique");
    do {
      if (sid.field_2._8_8_ == 0) goto LAB_001df9cb;
      __s = tinyxml2::XMLElement::Attribute((XMLElement *)sid.field_2._8_8_,"sid",(char *)0x0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_48,__s,&local_49);
      std::allocator<char>::~allocator(&local_49);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_48,"common");
      if (bVar1) {
        xml_local = (XMLElement *)sid.field_2._8_8_;
      }
      else {
        sid.field_2._8_8_ =
             (size_type)tinyxml2::XMLNode::NextSiblingElement(sid.field_2._8_8_,"technique");
      }
      std::__cxx11::string::~string((string *)local_48);
    } while (!bVar1);
  }
  return xml_local;
}

Assistant:

XMLElement* ColladaParser::get_technique_common( XMLElement* xml ) {

  XMLElement* common_profile = xml->FirstChildElement("profile_COMMON");
  if (common_profile) {
    XMLElement* technique = common_profile->FirstChildElement("technique");
    while (technique) {
      string sid = technique->Attribute("sid");
      if (sid == "common") return technique;
      technique = technique->NextSiblingElement("technique");
    }
  }

  return xml->FirstChildElement("technique_common");

}